

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O3

int Bac_PtrMemoryNtk(Vec_Ptr_t *vNtk)

{
  uint uVar1;
  void **ppvVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  if (vNtk == (Vec_Ptr_t *)0x0) {
    iVar5 = 0;
  }
  else {
    iVar5 = vNtk->nCap;
    auVar12._8_4_ = iVar5 >> 0x1f;
    auVar12._0_8_ = (long)iVar5;
    auVar12._12_4_ = 0x45300000;
    iVar5 = (int)(((auVar12._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,iVar5) - 4503599627370496.0)) * 8.0 + 16.0);
  }
  uVar1 = vNtk->nSize;
  if (1 < (int)uVar1) {
    ppvVar2 = vNtk->pArray;
    if ((int *)ppvVar2[1] == (int *)0x0) {
      iVar6 = 0;
    }
    else {
      iVar6 = *ppvVar2[1];
      auVar13._8_4_ = iVar6 >> 0x1f;
      auVar13._0_8_ = (long)iVar6;
      auVar13._12_4_ = 0x45300000;
      iVar6 = (int)(((auVar13._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,iVar6) - 4503599627370496.0)) * 8.0 + 16.0);
    }
    if (uVar1 != 2) {
      if ((int *)ppvVar2[2] == (int *)0x0) {
        iVar4 = 0;
      }
      else {
        iVar4 = *ppvVar2[2];
        auVar14._8_4_ = iVar4 >> 0x1f;
        auVar14._0_8_ = (long)iVar4;
        auVar14._12_4_ = 0x45300000;
        iVar4 = (int)(((auVar14._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,iVar4) - 4503599627370496.0)) * 8.0 + 16.0);
      }
      if (3 < uVar1) {
        lVar9 = (long)*(int *)((long)ppvVar2[3] + 4);
        if (lVar9 < 1) {
          iVar8 = 0;
        }
        else {
          lVar11 = 0;
          iVar8 = 0;
          do {
            piVar3 = *(int **)(*(long *)((long)ppvVar2[3] + 8) + lVar11 * 8);
            iVar7 = 0;
            if (piVar3 != (int *)0x0) {
              iVar7 = *piVar3;
              auVar15._8_4_ = iVar7 >> 0x1f;
              auVar15._0_8_ = (long)iVar7;
              auVar15._12_4_ = 0x45300000;
              iVar7 = (int)(((auVar15._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,iVar7) - 4503599627370496.0)) * 8.0 + 16.0)
              ;
            }
            iVar8 = iVar8 + iVar7;
            lVar11 = lVar11 + 1;
          } while (lVar9 != lVar11);
        }
        if (4 < (int)uVar1) {
          lVar9 = (long)*(int *)((long)ppvVar2[4] + 4);
          if (lVar9 < 1) {
            iVar7 = 0;
          }
          else {
            lVar11 = 0;
            iVar7 = 0;
            do {
              piVar3 = *(int **)(*(long *)((long)ppvVar2[4] + 8) + lVar11 * 8);
              iVar10 = 0;
              if (piVar3 != (int *)0x0) {
                iVar10 = *piVar3;
                auVar16._8_4_ = iVar10 >> 0x1f;
                auVar16._0_8_ = (long)iVar10;
                auVar16._12_4_ = 0x45300000;
                iVar10 = (int)(((auVar16._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,iVar10) - 4503599627370496.0)) * 8.0 +
                              16.0);
              }
              iVar7 = iVar7 + iVar10;
              lVar11 = lVar11 + 1;
            } while (lVar9 != lVar11);
          }
          return iVar4 + iVar8 + iVar6 + iVar5 + iVar7;
        }
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Bac_PtrMemoryNtk( Vec_Ptr_t * vNtk )
{
    int nBytes = (int)Vec_PtrMemory(vNtk);
    nBytes += Bac_PtrMemoryArray( (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 1) );
    nBytes += Bac_PtrMemoryArray( (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 2) );
    nBytes += Bac_PtrMemoryArrayArray( (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 3) );
    nBytes += Bac_PtrMemoryArrayArray( (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 4) );
    return nBytes;
}